

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void xmlXPathSumFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlXPathObjectPtr pxVar1;
  xmlNodeSetPtr pxVar2;
  xmlXPathObjectPtr value;
  int iVar3;
  int iVar4;
  long lVar5;
  double val;
  double dVar6;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs == 1) {
    iVar4 = ctxt->valueNr;
    if ((long)iVar4 < 1) {
      iVar4 = 0x17;
    }
    else {
      if ((ctxt->value != (xmlXPathObjectPtr)0x0) &&
         ((ctxt->value->type | XPATH_USERS) == XPATH_XSLT_TREE)) {
        iVar3 = iVar4 + -1;
        ctxt->valueNr = iVar3;
        if (iVar4 == 1) {
          pxVar1 = (xmlXPathObjectPtr)0x0;
        }
        else {
          pxVar1 = ctxt->valueTab[(long)iVar4 + -2];
        }
        ctxt->value = pxVar1;
        pxVar1 = ctxt->valueTab[iVar3];
        ctxt->valueTab[iVar3] = (xmlXPathObjectPtr)0x0;
        val = 0.0;
        if (((pxVar1->nodesetval != (xmlNodeSetPtr)0x0) && (pxVar1->nodesetval->nodeNr != 0)) &&
           (pxVar2 = pxVar1->nodesetval, 0 < pxVar2->nodeNr)) {
          lVar5 = 0;
          do {
            dVar6 = xmlXPathNodeToNumberInternal(ctxt,pxVar2->nodeTab[lVar5]);
            val = val + dVar6;
            lVar5 = lVar5 + 1;
            pxVar2 = pxVar1->nodesetval;
          } while (lVar5 < pxVar2->nodeNr);
        }
        value = xmlXPathCacheNewFloat(ctxt,val);
        xmlXPathValuePush(ctxt,value);
        xmlXPathReleaseObject(ctxt->context,pxVar1);
        return;
      }
      iVar4 = 0xb;
    }
  }
  else {
    iVar4 = 0xc;
  }
  xmlXPathErr(ctxt,iVar4);
  return;
}

Assistant:

void
xmlXPathSumFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr cur;
    int i;
    double res = 0.0;

    CHECK_ARITY(1);
    if ((ctxt->value == NULL) ||
	((ctxt->value->type != XPATH_NODESET) &&
	 (ctxt->value->type != XPATH_XSLT_TREE)))
	XP_ERROR(XPATH_INVALID_TYPE);
    cur = xmlXPathValuePop(ctxt);

    if ((cur->nodesetval != NULL) && (cur->nodesetval->nodeNr != 0)) {
	for (i = 0; i < cur->nodesetval->nodeNr; i++) {
	    res += xmlXPathNodeToNumberInternal(ctxt,
                                                cur->nodesetval->nodeTab[i]);
	}
    }
    xmlXPathValuePush(ctxt, xmlXPathCacheNewFloat(ctxt, res));
    xmlXPathReleaseObject(ctxt->context, cur);
}